

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O3

void * nvlist_pack(nvlist_t *nvl,size_t *sizep)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  void *pvVar4;
  char *__assertion;
  
  if (nvl == (nvlist_t *)0x0) {
    __assertion = "(nvl) != ((void*)0)";
  }
  else {
    if (nvl->nvl_magic == 0x6e766c) {
      iVar1 = nvl->nvl_error;
      if (iVar1 == 0) {
        sVar3 = nvlist_ndescriptors(nvl);
        if (sVar3 == 0) {
          pvVar4 = nvlist_xpack(nvl,(int64_t *)0x0,sizep);
          return pvVar4;
        }
        piVar2 = __errno_location();
        *piVar2 = 0x5f;
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = iVar1;
      }
      return (void *)0x0;
    }
    __assertion = "(nvl)->nvl_magic == 0x6e766c";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x3ef,"void *nvlist_pack(const nvlist_t *, size_t *)");
}

Assistant:

void *
nvlist_pack(const nvlist_t *nvl, size_t *sizep)
{

	NVLIST_ASSERT(nvl);

	if (nvl->nvl_error != 0) {
		ERRNO_SET(nvl->nvl_error);
		return (NULL);
	}

	if (nvlist_ndescriptors(nvl) > 0) {
		ERRNO_SET(EOPNOTSUPP);
		return (NULL);
	}

	return (nvlist_xpack(nvl, NULL, sizep));
}